

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

int lws_vbi_decode(void *buf,uint64_t *value,size_t len)

{
  int local_44;
  ulong uStack_40;
  int s;
  uint64_t v;
  uint8_t *end;
  uint8_t *p;
  size_t len_local;
  uint64_t *value_local;
  void *buf_local;
  
  uStack_40 = 0;
  local_44 = 0;
  end = (uint8_t *)buf;
  while( true ) {
    if ((uint8_t *)((long)buf + len) <= end) {
      return 0;
    }
    uStack_40 = ((ulong)*end & 0x7f) << ((byte)local_44 & 0x3f) | uStack_40;
    if ((*end & 0x80) != 0) break;
    local_44 = local_44 + 7;
    if (0x3f < local_44) {
      return 0;
    }
    end = end + 1;
  }
  *value = uStack_40;
  return (int)end - (int)buf;
}

Assistant:

int
lws_vbi_decode(const void *buf, uint64_t *value, size_t len)
{
	const uint8_t *p = (const uint8_t *)buf, *end = p + len;
	uint64_t v = 0;
	int s = 0;

	while (p < end) {
		v |= (((uint64_t)(*p)) & 0x7f) << s;
		if (*p & 0x80) {
			*value = v;

			return lws_ptr_diff(p, buf);
		}
		s += 7;
		if (s >= 64)
			return 0;
		p++;
	}

	return 0;
}